

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

int loop_restoration_row_worker(void *arg1,void *arg2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  pthread_mutex_t *__mutex;
  int *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  code *on_sync_read;
  ulong uVar9;
  ulong uVar10;
  code *on_sync_write;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  undefined8 *puVar14;
  int iVar15;
  uint uVar16;
  AV1LrSync *loop_res_sync;
  RestorationTileLimits local_40;
  
  puVar4 = *(undefined8 **)((long)arg2 + 0x10);
  __mutex = *(pthread_mutex_t **)((long)arg1 + 0x58);
  iVar7 = _setjmp((__jmp_buf_tag *)((long)arg2 + 0xf8));
  if (iVar7 == 0) {
    *(undefined4 *)((long)arg2 + 0xf0) = 1;
    do {
      pthread_mutex_lock(*(pthread_mutex_t **)((long)arg1 + 0x58));
      if (*(char *)((long)arg1 + 0x78) == '\0') {
        iVar7 = *(int *)((long)arg1 + 0x74);
        if (*(int *)((long)arg1 + 0x70) <= iVar7) goto LAB_003a9ab0;
        puVar14 = (undefined8 *)((long)iVar7 * 0x1c + *(long *)((long)arg1 + 0x68));
        *(int *)((long)arg1 + 0x74) = iVar7 + 1;
      }
      else {
LAB_003a9ab0:
        puVar14 = (undefined8 *)0x0;
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg1 + 0x58));
      if (puVar14 == (undefined8 *)0x0) break;
      local_40._8_8_ = *puVar14;
      on_sync_read = lr_sync_read;
      if (*(int *)(puVar14 + 2) != 1) {
        on_sync_read = av1_lr_sync_read_dummy;
      }
      iVar7 = *(int *)((long)puVar14 + 0xc);
      lVar8 = (long)iVar7;
      iVar1 = *(int *)(puVar4 + lVar8 * 7 + 3);
      on_sync_write = lr_sync_write;
      if (*(int *)(puVar14 + 2) != 0) {
        on_sync_write = av1_lr_sync_write_dummy;
      }
      lVar6 = puVar4[lVar8 * 7 + 1];
      av1_foreach_rest_unit_in_row
                (&local_40,iVar1,(rest_unit_visitor_t)*puVar4,*(int *)(puVar14 + 1),
                 *(int *)(lVar6 + 4),*(int *)(lVar6 + 0x10),*(int *)(lVar6 + 0xc),iVar7,
                 puVar4 + lVar8 * 7 + 1,*arg2,*(RestorationLineBuffers **)((long)arg2 + 8),
                 on_sync_read,on_sync_write,(AV1LrSyncData *)arg1,
                 (aom_internal_error_info *)((long)arg2 + 0x20));
      (*loop_restoration_row_worker::copy_funs[lVar8])
                ((YV12_BUFFER_CONFIG *)puVar4[0x17],(YV12_BUFFER_CONFIG *)puVar4[0x16],0,iVar1,
                 *(int *)((long)puVar14 + 0x14),*(int *)(puVar14 + 3));
      if (*(int *)((long)arg2 + 0x18) != 0) {
        aom_extend_frame_borders_plane_row_c
                  ((YV12_BUFFER_CONFIG *)puVar4[0x16],iVar7,*(int *)((long)puVar14 + 0x14),
                   *(int *)(puVar14 + 3));
      }
    } while (puVar14 != (undefined8 *)0x0);
    *(undefined4 *)((long)arg2 + 0xf0) = 0;
    iVar7 = 1;
  }
  else {
    *(undefined4 *)((long)arg2 + 0xf0) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg1 + 0x78) = 1;
    pthread_mutex_unlock(__mutex);
    lVar8 = 0;
    do {
      piVar5 = (int *)puVar4[lVar8 * 7 + 1];
      if ((*piVar5 != 0) && (iVar7 = *(int *)((long)puVar4 + lVar8 * 0x38 + 0x1c), 0 < iVar7)) {
        iVar1 = piVar5[1];
        iVar2 = piVar5[4];
        uVar9 = 0;
        uVar10 = uVar9;
        uVar11 = uVar9;
        uVar12 = uVar9;
        do {
          iVar15 = iVar7 - (int)uVar9;
          if ((iVar1 * 3) / 2 <= iVar15) {
            iVar15 = iVar1;
          }
          iVar13 = *(int *)((long)arg1 + 0x48) + iVar2;
          pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)arg1 + lVar8 * 8) + uVar10));
          lVar6 = *(long *)((long)arg1 + lVar8 * 8 + 0x30);
          iVar3 = *(int *)(lVar6 + uVar12);
          if (iVar13 < iVar3) {
            iVar13 = iVar3;
          }
          *(int *)(lVar6 + uVar12) = iVar13;
          pthread_cond_broadcast
                    ((pthread_cond_t *)(*(long *)((long)arg1 + lVar8 * 8 + 0x18) + uVar11));
          pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)arg1 + lVar8 * 8) + uVar10));
          uVar16 = iVar15 + (int)uVar9;
          uVar10 = uVar10 + 0x28;
          uVar11 = uVar11 + 0x30;
          uVar12 = uVar12 + 4;
          uVar9 = (ulong)uVar16;
        } while ((int)uVar16 < iVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int loop_restoration_row_worker(void *arg1, void *arg2) {
  AV1LrSync *const lr_sync = (AV1LrSync *)arg1;
  LRWorkerData *lrworkerdata = (LRWorkerData *)arg2;
  AV1LrStruct *lr_ctxt = (AV1LrStruct *)lrworkerdata->lr_ctxt;
  FilterFrameCtxt *ctxt = lr_ctxt->ctxt;
  int lr_unit_row;
  int plane;
  int plane_w;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = lr_sync->job_mutex;
#endif
  struct aom_internal_error_info *const error_info = &lrworkerdata->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    lr_sync->lr_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    // In case of loop restoration multithreading, the worker on an even lr
    // block row waits for the completion of the filtering of the top-right and
    // bottom-right blocks. Hence, in case a thread (main/worker) encounters an
    // error, update that filtering of every row in the frame is complete in
    // order to avoid the dependent workers from waiting indefinitely.
    set_loop_restoration_done(lr_sync, lr_ctxt->ctxt);
    return 0;
  }
  error_info->setjmp = 1;

  typedef void (*copy_fun)(const YV12_BUFFER_CONFIG *src_ybc,
                           YV12_BUFFER_CONFIG *dst_ybc, int hstart, int hend,
                           int vstart, int vend);
  static const copy_fun copy_funs[MAX_MB_PLANE] = {
    aom_yv12_partial_coloc_copy_y, aom_yv12_partial_coloc_copy_u,
    aom_yv12_partial_coloc_copy_v
  };

  while (1) {
    AV1LrMTInfo *cur_job_info = get_lr_job_info(lr_sync);
    if (cur_job_info != NULL) {
      RestorationTileLimits limits;
      sync_read_fn_t on_sync_read;
      sync_write_fn_t on_sync_write;
      limits.v_start = cur_job_info->v_start;
      limits.v_end = cur_job_info->v_end;
      lr_unit_row = cur_job_info->lr_unit_row;
      plane = cur_job_info->plane;
      plane_w = ctxt[plane].plane_w;

      // sync_mode == 1 implies only sync read is required in LR Multi-threading
      // sync_mode == 0 implies only sync write is required.
      on_sync_read =
          cur_job_info->sync_mode == 1 ? lr_sync_read : av1_lr_sync_read_dummy;
      on_sync_write = cur_job_info->sync_mode == 0 ? lr_sync_write
                                                   : av1_lr_sync_write_dummy;

      av1_foreach_rest_unit_in_row(
          &limits, plane_w, lr_ctxt->on_rest_unit, lr_unit_row,
          ctxt[plane].rsi->restoration_unit_size, ctxt[plane].rsi->horz_units,
          ctxt[plane].rsi->vert_units, plane, &ctxt[plane],
          lrworkerdata->rst_tmpbuf, lrworkerdata->rlbs, on_sync_read,
          on_sync_write, lr_sync, error_info);

      copy_funs[plane](lr_ctxt->dst, lr_ctxt->frame, 0, plane_w,
                       cur_job_info->v_copy_start, cur_job_info->v_copy_end);

      if (lrworkerdata->do_extend_border) {
        aom_extend_frame_borders_plane_row(lr_ctxt->frame, plane,
                                           cur_job_info->v_copy_start,
                                           cur_job_info->v_copy_end);
      }
    } else {
      break;
    }
  }
  error_info->setjmp = 0;
  return 1;
}